

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfunc.h
# Opt level: O0

int rapidjson::internal::StrCmp<char>(char *s1,char *s2)

{
  bool bVar1;
  uint local_20;
  byte *local_18;
  char *s2_local;
  char *s1_local;
  
  if (s1 == (char *)0x0) {
    __assert_fail("s1 != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/strfunc.h"
                  ,0x38,"int rapidjson::internal::StrCmp(const Ch *, const Ch *) [Ch = char]");
  }
  local_18 = (byte *)s2;
  s2_local = s1;
  if (s2 == (char *)0x0) {
    __assert_fail("s2 != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/strfunc.h"
                  ,0x39,"int rapidjson::internal::StrCmp(const Ch *, const Ch *) [Ch = char]");
  }
  while( true ) {
    bVar1 = false;
    if (*s2_local != '\0') {
      bVar1 = *s2_local == *local_18;
    }
    if (!bVar1) break;
    s2_local = s2_local + 1;
    local_18 = local_18 + 1;
  }
  if ((byte)*s2_local < *local_18) {
    local_20 = 0xffffffff;
  }
  else {
    local_20 = (uint)(*local_18 < (byte)*s2_local);
  }
  return local_20;
}

Assistant:

inline int StrCmp(const Ch* s1, const Ch* s2) {
    RAPIDJSON_ASSERT(s1 != 0);
    RAPIDJSON_ASSERT(s2 != 0);
    while(*s1 && (*s1 == *s2)) { s1++; s2++; }
    return static_cast<unsigned>(*s1) < static_cast<unsigned>(*s2) ? -1 : static_cast<unsigned>(*s1) > static_cast<unsigned>(*s2);
}